

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::traverseAnnotations
          (Node *this,Reader *annotations,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ListElementCount LVar1;
  Reader annotation;
  undefined1 local_78 [8];
  IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
  local_70;
  Reader local_60;
  
  local_70.index = 0;
  LVar1 = (annotations->reader).elementCount;
  local_70.container = annotations;
  for (; local_70.index != LVar1; local_70.index = local_70.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator*(&local_60,&local_70);
    Impl::findNode((Impl *)local_78,(uint64_t)this->module->compiler);
    if (local_78 != (undefined1  [8])0x0) {
      traverse((Node *)local_78,eagerness,seen,finalLoader,sourceInfo);
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverseAnnotations(const List<schema::Annotation>::Reader& annotations,
                                         uint eagerness,
                                         std::unordered_map<Node*, uint>& seen,
                                         const SchemaLoader& finalLoader,
                                         kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto annotation: annotations) {
    KJ_IF_SOME(node, module->getCompiler().findNode(annotation.getId())) {
      node.traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }
}